

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithmFORTRAN_wrap.cxx
# Opt level: O3

int find_sorted<int>(int *DATA,size_t SIZE,int value)

{
  ulong uVar1;
  int *piVar2;
  _DistanceType __len;
  int iVar3;
  ulong uVar4;
  size_t sVar5;
  
  uVar1 = SIZE;
  piVar2 = DATA;
  if (0 < (long)SIZE) {
    do {
      uVar4 = uVar1 >> 1;
      if (piVar2[uVar4] < value) {
        piVar2 = piVar2 + uVar4 + 1;
        uVar4 = ~uVar4 + uVar1;
      }
      uVar1 = uVar4;
    } while (0 < (long)uVar4);
  }
  sVar5 = (long)piVar2 - (long)DATA >> 2;
  iVar3 = 0;
  if ((sVar5 != SIZE) && (iVar3 = 0, *(int *)((long)DATA + ((long)piVar2 - (long)DATA)) == value)) {
    iVar3 = (int)sVar5 + 1;
  }
  return iVar3;
}

Assistant:

int find_sorted(const T *DATA, size_t SIZE, T value) {
  size_t result = std::lower_bound(DATA, DATA + SIZE, value) - DATA;
  if (result == SIZE || DATA[result] != value) return 0;
  return result + 1;
}